

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O0

void processJob(UA_Server *server,UA_Job *job)

{
  UA_Connection *connection;
  UA_Job *job_local;
  UA_Server *server_local;
  
  switch(job->type) {
  case UA_JOBTYPE_NOTHING:
    break;
  case UA_JOBTYPE_DETACHCONNECTION:
    UA_Connection_detachSecureChannel((job->job).closeConnection);
    break;
  case UA_JOBTYPE_BINARYMESSAGE_NETWORKLAYER:
    UA_Server_processBinaryMessage
              (server,(job->job).closeConnection,&(job->job).binaryMessage.message);
    (*((job->job).closeConnection)->releaseRecvBuffer)
              ((job->job).closeConnection,&(job->job).binaryMessage.message);
    break;
  case UA_JOBTYPE_BINARYMESSAGE_ALLOCATED:
    UA_Server_processBinaryMessage
              (server,(job->job).closeConnection,&(job->job).binaryMessage.message);
    UA_ByteString_deleteMembers(&(job->job).binaryMessage.message);
    break;
  case UA_JOBTYPE_METHODCALL:
  case UA_JOBTYPE_METHODCALL_DELAYED:
    (*(job->job).methodCall.method)(server,(job->job).closeConnection);
    break;
  default:
    UA_LOG_WARNING((server->config).logger,UA_LOGCATEGORY_SERVER,
                   "Trying to execute a job of unknown type");
  }
  return;
}

Assistant:

static void
processJob(UA_Server *server, UA_Job *job) {
    UA_ASSERT_RCU_UNLOCKED();
    UA_RCU_LOCK();
    switch(job->type) {
    case UA_JOBTYPE_NOTHING:
        break;
    case UA_JOBTYPE_DETACHCONNECTION:
        UA_Connection_detachSecureChannel(job->job.closeConnection);
        break;
    case UA_JOBTYPE_BINARYMESSAGE_NETWORKLAYER:
        UA_Server_processBinaryMessage(server, job->job.binaryMessage.connection,
                                       &job->job.binaryMessage.message);
        UA_Connection *connection = job->job.binaryMessage.connection;
        connection->releaseRecvBuffer(connection, &job->job.binaryMessage.message);
        break;
    case UA_JOBTYPE_BINARYMESSAGE_ALLOCATED:
        UA_Server_processBinaryMessage(server, job->job.binaryMessage.connection,
                                       &job->job.binaryMessage.message);
        UA_ByteString_deleteMembers(&job->job.binaryMessage.message);
        break;
    case UA_JOBTYPE_METHODCALL:
    case UA_JOBTYPE_METHODCALL_DELAYED:
        job->job.methodCall.method(server, job->job.methodCall.data);
        break;
    default:
        UA_LOG_WARNING(server->config.logger, UA_LOGCATEGORY_SERVER,
                       "Trying to execute a job of unknown type");
        break;
    }
    UA_RCU_UNLOCK();
}